

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

aiReturn __thiscall Assimp::Importer::UnregisterPPStep(Importer *this,BaseProcess *pImp)

{
  BaseProcess **__src;
  pointer *pppBVar1;
  ImporterPimpl *pIVar2;
  BaseProcess **ppBVar3;
  __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
  __dest;
  Logger *pLVar4;
  aiReturn aVar5;
  BaseProcess *local_28;
  
  if (pImp == (BaseProcess *)0x0) {
    aVar5 = aiReturn_SUCCESS;
  }
  else {
    local_28 = pImp;
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<Assimp::BaseProcess**,std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::BaseProcess*const>>
                       ((this->pimpl->mPostProcessingSteps).
                        super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->pimpl->mPostProcessingSteps).
                        super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_28);
    pIVar2 = this->pimpl;
    ppBVar3 = (pIVar2->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (__dest._M_current == ppBVar3) {
      pLVar4 = DefaultLogger::get();
      Logger::warn(pLVar4,"Unable to remove custom post-processing step: I can\'t find you ..");
    }
    else {
      __src = __dest._M_current + 1;
      if (__src != ppBVar3) {
        memmove(__dest._M_current,__src,(long)ppBVar3 - (long)__src);
      }
      pppBVar1 = &(pIVar2->mPostProcessingSteps).
                  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + -1;
      pLVar4 = DefaultLogger::get();
      Logger::info(pLVar4,"Unregistering custom post-processing step");
    }
    aVar5 = -(uint)(__dest._M_current == ppBVar3);
  }
  return aVar5;
}

Assistant:

aiReturn Importer::UnregisterPPStep(BaseProcess* pImp) {
    if(!pImp) {
        // unregistering a NULL ppstep is no problem for us ... really!
        return AI_SUCCESS;
    }

    ASSIMP_BEGIN_EXCEPTION_REGION();
    std::vector<BaseProcess*>::iterator it = std::find(pimpl->mPostProcessingSteps.begin(),
        pimpl->mPostProcessingSteps.end(),pImp);

    if (it != pimpl->mPostProcessingSteps.end())    {
        pimpl->mPostProcessingSteps.erase(it);
        ASSIMP_LOG_INFO("Unregistering custom post-processing step");
        return AI_SUCCESS;
    }
    ASSIMP_LOG_WARN("Unable to remove custom post-processing step: I can't find you ..");
    ASSIMP_END_EXCEPTION_REGION(aiReturn);

    return AI_FAILURE;
}